

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outchars.c
# Opt level: O1

void darken_symdef(curses_symdef_conflict *sym)

{
  int iVar1;
  
  if (ui_flags.unicode != '\0') {
    if (sym->unichar[0] == L' ') {
      return;
    }
    if ((sym->unichar[0] == L'\0') && (sym->ch == 0x20)) {
      return;
    }
    if (ui_flags.unicode != '\0') goto LAB_0011322f;
  }
  if (sym->ch == 0x20) {
    return;
  }
LAB_0011322f:
  iVar1 = darken(sym->color);
  sym->color = iVar1;
  return;
}

Assistant:

static void darken_symdef(struct curses_symdef *sym)
{
    /*
     * Avoid black-on-black with darkgray trick on blank spaces (see darken()),
     * and a blinking dark blue cursor on black otherwise.
     */
    if ((ui_flags.unicode && (sym->unichar[0] == ' ' ||
			      (sym->unichar[0] == '\0' && sym->ch == ' '))) ||
	(!ui_flags.unicode && sym->ch == ' '))
	return;
    sym->color = darken(sym->color);
}